

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int ptls_is_ech_handshake
              (ptls_t *tls,uint8_t *config_id,ptls_hpke_kem_t **kem,
              ptls_hpke_cipher_suite_t **cipher)

{
  ptls_hpke_cipher_suite_t **cipher_local;
  ptls_hpke_kem_t **kem_local;
  uint8_t *config_id_local;
  ptls_t *tls_local;
  
  if ((*(byte *)&tls->ech >> 2 & 1) == 0) {
    tls_local._4_4_ = 0;
  }
  else {
    if (config_id != (uint8_t *)0x0) {
      *config_id = (tls->ech).config_id;
    }
    if (kem != (ptls_hpke_kem_t **)0x0) {
      *kem = (tls->ech).kem;
    }
    if (cipher != (ptls_hpke_cipher_suite_t **)0x0) {
      *cipher = (tls->ech).cipher;
    }
    tls_local._4_4_ = 1;
  }
  return tls_local._4_4_;
}

Assistant:

int ptls_is_ech_handshake(ptls_t *tls, uint8_t *config_id, ptls_hpke_kem_t **kem, ptls_hpke_cipher_suite_t **cipher)
{
    if (tls->ech.accepted) {
        if (config_id != NULL)
            *config_id = tls->ech.config_id;
        if (kem != NULL)
            *kem = tls->ech.kem;
        if (cipher != NULL)
            *cipher = tls->ech.cipher;
        return 1;
    }
    return 0;
}